

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desugarer.cpp
# Opt level: O2

Apply * __thiscall jsonnet::internal::Desugarer::length(Desugarer *this,AST *v)

{
  Apply *pAVar1;
  allocator<char32_t> local_39;
  UString local_38;
  
  ::std::__cxx11::u32string::u32string<std::allocator<char32_t>>
            ((u32string *)&local_38,L"length",&local_39);
  pAVar1 = stdFunc(this,&local_38,v);
  ::std::__cxx11::u32string::~u32string((u32string *)&local_38);
  return pAVar1;
}

Assistant:

Apply *length(AST *v)
    {
        return stdFunc(U"length", v);
    }